

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

void __thiscall Circuit::recompute_map(Circuit *this)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  uint uVar5;
  long in_RDI;
  uint i_2;
  uint cnt;
  uint i_1;
  uint i;
  uint nG;
  undefined4 local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar6;
  
  sVar2 = std::vector<GateType,_std::allocator<GateType>_>::size
                    ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38));
  uVar5 = (uint)sVar2;
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xb4) = 0;
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    pvVar3 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),(ulong)uVar6)
    ;
    if (*pvVar3 == AND) {
      *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) + 1;
      *(int *)(in_RDI + 0xb4) = *(int *)(in_RDI + 0xb4) + 1;
    }
    pvVar3 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),(ulong)uVar6)
    ;
    if (*pvVar3 == MAND) {
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x68),(ulong)uVar6);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      *(int *)(in_RDI + 0xb4) = *(int *)(in_RDI + 0xb4) + (int)sVar2;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar5,uVar6),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar5,uVar6),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    vVar1 = uVar5 << 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x98),
                        (ulong)uVar6);
    *pvVar4 = vVar1;
  }
  uVar6 = 0;
  for (local_1c = 0; local_1c < uVar5; local_1c = local_1c + 1) {
    pvVar3 = std::vector<GateType,_std::allocator<GateType>_>::operator[]
                       ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0x38),
                        (ulong)local_1c);
    if (*pvVar3 == AND) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x80),
                          (ulong)uVar6);
      *pvVar4 = local_1c;
      vVar1 = uVar6;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x98),
                          (ulong)local_1c);
      *pvVar4 = uVar6;
      uVar6 = vVar1 + 1;
    }
  }
  return;
}

Assistant:

void Circuit::recompute_map() {
  unsigned int nG = GateT.size();

  num_AND = 0;
  total_num_AND = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      num_AND++;
      total_num_AND++;
    }
    if (GateT[i] == MAND) {
      total_num_AND += GateO[i].size();
    }
  }

  // Define map between AND gates and the actual gates
  map.resize(num_AND);
  imap.resize(nG);

  // Set stupid default value for imap, to be caught in access function
  for (unsigned int i = 0; i < nG; i++) {
    imap[i] = 2 * nG;
  }
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < nG; i++) {
    if (GateT[i] == AND) {
      map[cnt] = i;
      imap[i] = cnt;
      cnt++;
    }
  }
}